

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImportDirWrapper.h
# Opt level: O2

offset_t __thiscall ImportEntryWrapper::getNextEntryOffset(ImportEntryWrapper *this)

{
  Executable *pEVar1;
  int iVar2;
  undefined4 extraout_var;
  offset_t oVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  iVar2 = (*(this->super_ImportBaseEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
            super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x21])();
  if (CONCAT44(extraout_var,iVar2) != 0) {
    oVar3 = ExeNodeWrapper::getNextEntryOffset((ExeNodeWrapper *)this);
    return oVar3;
  }
  iVar2 = (*(this->super_ImportBaseEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
            super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0xc])(this);
  if (CONCAT44(extraout_var_00,iVar2) != 0) {
    pEVar1 = (this->super_ImportBaseEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
             super_ExeElementWrapper.m_Exe;
    iVar2 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0x17])
                      (pEVar1,(ulong)*(uint *)(CONCAT44(extraout_var_00,iVar2) + 0x10),2,1);
    return CONCAT44(extraout_var_01,iVar2);
  }
  return 0xffffffffffffffff;
}

Assistant:

virtual offset_t getNextEntryOffset()
    {
         offset_t nextOffset = INVALID_ADDR;
        //get after existing entries:
        if (this->getEntriesCount() > 0) {
            return ExeNodeWrapper::getNextEntryOffset();
        }
        //get by thunk:
        IMAGE_IMPORT_DESCRIPTOR* desc = (IMAGE_IMPORT_DESCRIPTOR*) this->getPtr();
        if (!desc) return INVALID_ADDR;

        offset_t firstThunk = desc->FirstThunk;
        if (firstThunk == 0) {
            firstThunk = desc->OriginalFirstThunk;
        }
        nextOffset = m_Exe->convertAddr(desc->FirstThunk, Executable::RVA, Executable::RAW);
        return nextOffset;
    }